

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEditPrivate::updateEditFieldGeometry(QDateTimeEditPrivate *this)

{
  QWidget *widget;
  QWidget *this_00;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QStyleOptionComboBox optCombo;
  QRect local_c0;
  QStyleOptionComboBox local_b0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->calendarPopup == true) &&
     (((this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x3f00) != 0)) {
    widget = *(QWidget **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    memset(&local_b0,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox(&local_b0);
    QStyleOption::initFrom((QStyleOption *)&local_b0,widget);
    local_b0.editable = true;
    local_b0.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
    super_QFlagsStorage<QStyle::SubControl>.i =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0x2;
    this_00 = &((this->super_QAbstractSpinBoxPrivate).edit)->super_QWidget;
    pQVar1 = QWidget::style(widget);
    local_c0 = (QRect)(**(code **)(*(long *)pQVar1 + 0xd8))(pQVar1,1,&local_b0,2,widget);
    QWidget::setGeometry(this_00,&local_c0);
    QIcon::~QIcon(&local_b0.currentIcon);
    if (&(local_b0.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_b0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_b0.currentText.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)&local_b0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QAbstractSpinBoxPrivate::updateEditFieldGeometry(&this->super_QAbstractSpinBoxPrivate);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateEditFieldGeometry()
{
    if (!calendarPopupEnabled()) {
        QAbstractSpinBoxPrivate::updateEditFieldGeometry();
        return;
    }

    Q_Q(QDateTimeEdit);

    QStyleOptionComboBox optCombo;
    optCombo.initFrom(q);
    optCombo.editable = true;
    optCombo.subControls = QStyle::SC_ComboBoxEditField;
    edit->setGeometry(q->style()->subControlRect(QStyle::CC_ComboBox, &optCombo,
                                                 QStyle::SC_ComboBoxEditField, q));
}